

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

int intra_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int *bmode_costs,int64_t *best_rd,
                   int *rate,int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,
                   MB_MODE_INFO *best_mbmi,PICK_MODE_CONTEXT *ctx)

{
  bool bVar1;
  bool bVar2;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *pMVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  int64_t ref_best_rd;
  uint discount_color_cost;
  byte bVar9;
  long lVar10;
  RD_STATS rd_stats;
  RD_STATS local_58;
  int *piVar8;
  
  if ((cpi->sf).tx_sf.use_rd_based_breakout_for_intra_tx_search == true) {
    ref_best_rd = *best_rd;
  }
  else {
    ref_best_rd = 0x7fffffffffffffff;
  }
  mbmi = *(x->e_mbd).mi;
  piVar8 = rate;
  av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_58,bsize,ref_best_rd);
  discount_color_cost = (uint)piVar8;
  iVar4 = 0;
  if (local_58.rate != 0x7fffffff) {
    iVar6 = local_58.rate;
    if (((x->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) && (mbmi->bsize != BLOCK_4X4))
    {
      iVar6 = 0;
      if ((bsize != BLOCK_4X4) && (iVar6 = 0, (x->txfm_search_params).tx_mode_search_type == '\x02')
         ) {
        lVar10 = 0;
        for (bVar7 = ""[bsize]; bVar7 != mbmi->tx_size; bVar7 = ""[bVar7]) {
          lVar10 = lVar10 + 1;
        }
        bVar1 = (x->e_mbd).up_available;
        bVar2 = (x->e_mbd).left_available;
        bVar7 = *(x->e_mbd).above_txfm_context;
        if ((bVar1 == true) &&
           ((pMVar3 = (x->e_mbd).above_mbmi, (pMVar3->field_0xa7 & 0x80) != 0 ||
            ('\0' < pMVar3->ref_frame[0])))) {
          bVar7 = block_size_wide[pMVar3->bsize];
        }
        bVar9 = *(x->e_mbd).left_txfm_context;
        if ((bVar2 != false) &&
           ((pMVar3 = (x->e_mbd).left_mbmi, (pMVar3->field_0xa7 & 0x80) != 0 ||
            ('\0' < pMVar3->ref_frame[0])))) {
          bVar9 = block_size_high[pMVar3->bsize];
        }
        discount_color_cost = (uint)bVar9;
        iVar6 = *(int *)((long)(x->mode_costs).skip_txfm_cost +
                        lVar10 * 4 +
                        (ulong)(byte)(bVar1 & tx_size_wide[""[(*(x->e_mbd).mi)->bsize]] <=
                                              (int)(uint)bVar7) * 0x14 +
                        (ulong)(byte)(bVar2 & tx_size_high[""[(*(x->e_mbd).mi)->bsize]] <=
                                              (int)(uint)bVar9) * 0x14 +
                        (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] * 0x3c
                        + -0x24);
      }
      iVar6 = local_58.rate - iVar6;
    }
    iVar5 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,bmode_costs[mbmi->mode],discount_color_cost);
    lVar10 = local_58.dist * 0x80 + ((long)x->rdmult * (long)(iVar5 + local_58.rate) + 0x100 >> 9);
    iVar4 = 0;
    if (lVar10 < *best_rd) {
      memcpy(best_mbmi,mbmi,0xb0);
      *best_rd = lVar10;
      *rate = iVar5 + local_58.rate;
      *rate_tokenonly = iVar6;
      *distortion = local_58.dist;
      *skippable = local_58.skip_txfm;
      memcpy(ctx->blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
      memcpy(ctx->tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static inline int intra_block_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, const int *bmode_costs,
                                  int64_t *best_rd, int *rate,
                                  int *rate_tokenonly, int64_t *distortion,
                                  uint8_t *skippable, MB_MODE_INFO *best_mbmi,
                                  PICK_MODE_CONTEXT *ctx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  RD_STATS rd_stats;
  // In order to improve txfm search, avoid rd based breakouts during winner
  // mode evaluation. Hence passing ref_best_rd as INT64_MAX by default when the
  // speed feature use_rd_based_breakout_for_intra_tx_search is disabled.
  int64_t ref_best_rd = cpi->sf.tx_sf.use_rd_based_breakout_for_intra_tx_search
                            ? *best_rd
                            : INT64_MAX;
  av1_pick_uniform_tx_size_type_yrd(cpi, x, &rd_stats, bsize, ref_best_rd);
  if (rd_stats.rate == INT_MAX) return 0;
  int this_rate_tokenonly = rd_stats.rate;
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
    // av1_pick_uniform_tx_size_type_yrd above includes the cost of the tx_size
    // in the tokenonly rate, but for intra blocks, tx_size is always coded
    // (prediction granularity), so we account for it in the full rate,
    // not the tokenonly rate.
    this_rate_tokenonly -= tx_size_cost(x, bsize, mbmi->tx_size);
  }
  const int this_rate =
      rd_stats.rate +
      intra_mode_info_cost_y(cpi, x, mbmi, bsize, bmode_costs[mbmi->mode], 0);
  const int64_t this_rd = RDCOST(x->rdmult, this_rate, rd_stats.dist);
  if (this_rd < *best_rd) {
    *best_mbmi = *mbmi;
    *best_rd = this_rd;
    *rate = this_rate;
    *rate_tokenonly = this_rate_tokenonly;
    *distortion = rd_stats.dist;
    *skippable = rd_stats.skip_txfm;
    av1_copy_array(ctx->blk_skip, x->txfm_search_info.blk_skip,
                   ctx->num_4x4_blk);
    av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    return 1;
  }
  return 0;
}